

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,EnumReservedRange *proto,EnumDescriptor *parent,
          ReservedRange *result)

{
  int iVar1;
  int iVar2;
  
  iVar1 = proto->start_;
  result->start = iVar1;
  iVar2 = proto->end_;
  result->end = iVar2;
  if (iVar2 < iVar1) {
    AddError(this,*(string **)(parent + 8),&proto->super_Message,NUMBER,
             "Reserved range end number must be greater than start number.");
    return;
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const EnumDescriptorProto::EnumReservedRange& proto,
    const EnumDescriptor* parent, EnumDescriptor::ReservedRange* result) {
  result->start = proto.start();
  result->end = proto.end();

  if (result->start > result->end) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved range end number must be greater than start number.");
  }
}